

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zesDeviceEnumActiveVFExp
          (zes_device_handle_t hDevice,uint32_t *pCount,zes_vf_handle_t *phVFhandle)

{
  ze_result_t zVar1;
  ulong uVar2;
  
  if (DAT_0010ea90 != (code *)0x0) {
    zVar1 = (*DAT_0010ea90)();
    return zVar1;
  }
  if (phVFhandle != (zes_vf_handle_t *)0x0) {
    uVar2 = 0;
    do {
      if (*pCount <= uVar2) {
        return ZE_RESULT_SUCCESS;
      }
      context_t::get()::count = context_t::get()::count + 1;
      phVFhandle[uVar2] = context_t::get()::count;
      uVar2 = uVar2 + 1;
    } while (phVFhandle != (zes_vf_handle_t *)0x0);
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceEnumActiveVFExp(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        uint32_t* pCount,                               ///< [in,out] pointer to the number of components of this type.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of components of this type that are available.
                                                        ///< if count is greater than the number of components of this type that
                                                        ///< are available, then the driver shall update the value with the correct
                                                        ///< number of components.
        zes_vf_handle_t* phVFhandle                     ///< [in,out][optional][range(0, *pCount)] array of handle of components of
                                                        ///< this type.
                                                        ///< if count is less than the number of components of this type that are
                                                        ///< available, then the driver shall only retrieve that number of
                                                        ///< component handles.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnEnumActiveVFExp = context.zesDdiTable.DeviceExp.pfnEnumActiveVFExp;
        if( nullptr != pfnEnumActiveVFExp )
        {
            result = pfnEnumActiveVFExp( hDevice, pCount, phVFhandle );
        }
        else
        {
            // generic implementation
            for( size_t i = 0; ( nullptr != phVFhandle ) && ( i < *pCount ); ++i )
                phVFhandle[ i ] = reinterpret_cast<zes_vf_handle_t>( context.get() );

        }

        return result;
    }